

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void __thiscall
QHashPrivate::MultiNode<QByteArray,QByteArray>::insertMulti<QByteArray_const&>
          (MultiNode<QByteArray,QByteArray> *this,QByteArray *args)

{
  Data *pDVar1;
  QArrayDataPointer<char> *this_00;
  
  this_00 = (QArrayDataPointer<char> *)operator_new(0x20);
  QArrayDataPointer<char>::QArrayDataPointer(this_00,&args->d);
  pDVar1 = *(Data **)(this + 0x18);
  *(QArrayDataPointer<char> **)(this + 0x18) = this_00;
  this_00[1].d = pDVar1;
  return;
}

Assistant:

void insertMulti(Args &&... args)
    {
        Chain *e = new Chain{ T(std::forward<Args>(args)...), nullptr };
        e->next = std::exchange(value, e);
    }